

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

ElementDocument * __thiscall Rml::Context::CreateDocument(Context *this,String *instancer_name)

{
  char *pcVar1;
  ElementDocument *document;
  ElementPtr element;
  ElementPtr local_40;
  XMLAttributes local_38;
  
  local_38.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Factory::InstanceElement
            ((Factory *)&element,(Element *)0x0,instancer_name,&this->documents_base_tag,&local_38);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_38.m_container);
  if ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)
      element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0) {
    document = (ElementDocument *)0x0;
    Log::Message(LT_ERROR,
                 "Failed to instance document on instancer_name \'%s\', instancer returned nullptr."
                 ,(instancer_name->_M_dataplus)._M_p);
  }
  else {
    document = rmlui_dynamic_cast<Rml::ElementDocument*,Rml::Element*>
                         ((Element *)
                          element._M_t.
                          super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    if (document == (ElementDocument *)0x0) {
      pcVar1 = *(char **)(*(long *)(*(long *)element._M_t.
                                             super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                             .super__Head_base<0UL,_Rml::Element_*,_false>.
                                             _M_head_impl + -8) + 8);
      document = (ElementDocument *)0x0;
      Log::Message(LT_ERROR,
                   "Failed to instance document on instancer_name \'%s\', Found type \'%s\', was expecting derivative of ElementDocument."
                   ,(instancer_name->_M_dataplus)._M_p,pcVar1 + (*pcVar1 == '*'));
    }
    else {
      document->context = this;
      local_40 = (ElementPtr)
                 (ElementPtr)
                 element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
                 .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
      element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
           (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
           (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0;
      Element::AppendChild
                ((this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                 ._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,&local_40,true);
      ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_40);
      PluginRegistry::NotifyDocumentLoad(document);
    }
  }
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&element);
  return document;
}

Assistant:

ElementDocument* Context::CreateDocument(const String& instancer_name)
{
	ElementPtr element = Factory::InstanceElement(nullptr, instancer_name, documents_base_tag, XMLAttributes());
	if (!element)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document on instancer_name '%s', instancer returned nullptr.", instancer_name.c_str());
		return nullptr;
	}

	ElementDocument* document = rmlui_dynamic_cast<ElementDocument*>(element.get());
	if (!document)
	{
		Log::Message(Log::LT_ERROR,
			"Failed to instance document on instancer_name '%s', Found type '%s', was expecting derivative of ElementDocument.",
			instancer_name.c_str(), rmlui_type_name(*element));
		return nullptr;
	}

	document->context = this;
	root->AppendChild(std::move(element));

	PluginRegistry::NotifyDocumentLoad(document);

	return document;
}